

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O0

string * __thiscall
glcts::(anonymous_namespace)::GatherGLSLCompile::Uniforms_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_19;
  void *local_18;
  GatherGLSLCompile *this_local;
  
  local_18 = this;
  this_local = (GatherGLSLCompile *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "uniform mediump sampler2D tex_2d;                  \nuniform mediump isamplerCube itex_cube;            \nuniform mediump usampler2DArray utex_2da;          \nuniform mediump sampler2DShadow tex_2ds;           \nuniform mediump samplerCubeShadow tex_cubes;       \nuniform mediump sampler2DArrayShadow tex_2das;     \n"
             ,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Uniforms()
	{
		return "uniform mediump sampler2D tex_2d;                  \n"
			   "uniform mediump isamplerCube itex_cube;            \n"
			   "uniform mediump usampler2DArray utex_2da;          \n"
			   ""
			   "uniform mediump sampler2DShadow tex_2ds;           \n"
			   "uniform mediump samplerCubeShadow tex_cubes;       \n"
			   "uniform mediump sampler2DArrayShadow tex_2das;     \n";
	}